

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lookup.cpp
# Opt level: O3

void slang::ast::Lookup::selectChild
               (Type *virtualInterface,SourceRange range,
               span<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>,_18446744073709551615UL>
               selectors,ASTContext *context,LookupResult *result)

{
  variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector> *__v
  ;
  pointer pNVar1;
  SourceLocation *pSVar2;
  Compilation *dst;
  undefined8 uVar3;
  size_t sVar4;
  char *pcVar5;
  NameComponents name;
  span<const_slang::ast::(anonymous_namespace)::NamePlusLoc,_18446744073709551615UL> nameParts_00;
  __extent_storage<18446744073709551615UL> _Var6;
  SourceLocation p;
  __extent_storage<18446744073709551615UL> _Var7;
  int iVar8;
  variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
  *pvVar9;
  EVP_PKEY_CTX *pEVar10;
  undefined4 extraout_var;
  SourceLocation SVar11;
  long lVar12;
  variant_alternative_t<0UL,_variant<const_ElementSelectSyntax_*,_MemberSelector>_> *args;
  SourceLocation SVar13;
  Symbol *pSVar14;
  EVP_PKEY_CTX *pEVar15;
  long lVar16;
  EVP_PKEY_CTX *src;
  SourceLocation extraout_RDX;
  SourceLocation extraout_RDX_00;
  SourceLocation extraout_RDX_01;
  SourceLocation extraout_RDX_02;
  SourceLocation SVar17;
  SourceLocation SVar18;
  SourceLocation extraout_RDX_03;
  SourceLocation SVar19;
  __extent_storage<18446744073709551615UL> _Var20;
  SourceLocation __src;
  ulong uVar21;
  bool bVar22;
  byte bVar23;
  SourceRange range_00;
  SmallVector<const_slang::syntax::ElementSelectSyntax_*,_5UL> elementSelects;
  NameComponents unused;
  SmallVector<slang::ast::(anonymous_namespace)::NamePlusLoc,_4UL> nameParts;
  SmallVectorBase<const_slang::syntax::ElementSelectSyntax_*> local_1e8 [2];
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  ParameterValueAssignmentSyntax *local_178;
  SourceLocation local_168;
  __extent_storage<18446744073709551615UL> local_160;
  ulong local_158;
  undefined1 local_150 [288];
  
  _Var20 = selectors._M_extent._M_extent_value;
  bVar23 = 0;
  local_188 = 0;
  uStack_180 = 0;
  local_198 = 0;
  uStack_190 = 0;
  local_1a8 = 0;
  uStack_1a0 = 0;
  local_178 = (ParameterValueAssignmentSyntax *)0x0;
  local_168 = (SourceLocation)local_150;
  local_160._M_extent_value = 0;
  local_158 = 4;
  local_1e8[0].data_ = (pointer)local_1e8[0].firstElement;
  local_1e8[0].len = 0;
  local_1e8[0].cap = 5;
  if ((pointer)_Var20._M_extent_value != (pointer)0x0) {
    dst = ((context->scope).ptr)->compilation;
    pvVar9 = selectors._M_ptr + _Var20._M_extent_value;
    SVar18 = range.endLoc;
    do {
      __v = pvVar9 + -1;
      if (pvVar9[-1].
          super__Variant_base<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
          .
          super__Move_assign_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
          .
          super__Copy_assign_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
          .
          super__Move_ctor_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
          .
          super__Copy_ctor_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
          .
          super__Variant_storage_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
          ._M_index == '\x01') {
        SVar13 = *(SourceLocation *)
                  ((long)&pvVar9[-1].
                          super__Variant_base<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                          .
                          super__Move_assign_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                          .
                          super__Copy_assign_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                          .
                          super__Move_ctor_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                          .
                          super__Copy_ctor_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                          .
                          super__Variant_storage_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                          ._M_u + 0x10);
        sVar4 = *(size_t *)
                 &(__v->
                  super__Variant_base<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                  ).
                  super__Move_assign_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                  .
                  super__Copy_assign_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                  .
                  super__Move_ctor_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                  .
                  super__Copy_ctor_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                  .
                  super__Variant_storage_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                  ._M_u;
        pcVar5 = *(char **)((long)&pvVar9[-1].
                                   super__Variant_base<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                                   .
                                   super__Move_assign_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                                   .
                                   super__Copy_assign_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                                   .
                                   super__Move_ctor_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                                   .
                                   super__Copy_ctor_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                                   .
                                   super__Variant_storage_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                                   ._M_u + 8);
        SVar17 = *(SourceLocation *)
                  ((long)&pvVar9[-1].
                          super__Variant_base<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                          .
                          super__Move_assign_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                          .
                          super__Copy_assign_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                          .
                          super__Move_ctor_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                          .
                          super__Copy_ctor_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                          .
                          super__Variant_storage_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                          ._M_u + 0x18);
        SVar19 = *(SourceLocation *)
                  ((long)&pvVar9[-1].
                          super__Variant_base<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                          .
                          super__Move_assign_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                          .
                          super__Copy_assign_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                          .
                          super__Move_ctor_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                          .
                          super__Copy_ctor_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                          .
                          super__Variant_storage_alias<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>
                          ._M_u + 0x20);
        src = (EVP_PKEY_CTX *)CONCAT71(SVar18._1_7_,local_1e8[0].len != 0);
        pEVar15 = (EVP_PKEY_CTX *)((long)local_1e8[0].data_ + local_1e8[0].len * 8 + -8);
        if (local_1e8[0].data_ < pEVar15 && local_1e8[0].len != 0) {
          pEVar10 = (EVP_PKEY_CTX *)((long)local_1e8[0].data_ + 8);
          do {
            uVar3 = *(undefined8 *)(pEVar10 + -8);
            *(undefined8 *)(pEVar10 + -8) = *(undefined8 *)pEVar15;
            *(undefined8 *)pEVar15 = uVar3;
            pEVar15 = pEVar15 + -8;
            src = pEVar10 + 8;
            bVar22 = pEVar10 < pEVar15;
            pEVar10 = src;
          } while (bVar22);
        }
        iVar8 = SmallVectorBase<const_slang::syntax::ElementSelectSyntax_*>::copy
                          (local_1e8,(EVP_PKEY_CTX *)dst,src);
        _Var7._M_extent_value = local_160._M_extent_value;
        __src = (SourceLocation)(local_160._M_extent_value * 0x48 + (long)local_168);
        if (local_160._M_extent_value == local_158) {
          if (-local_160._M_extent_value == -0x1c71c71c71c71c7) {
            slang::detail::throwLengthError();
          }
          uVar21 = local_160._M_extent_value + 1;
          if (local_160._M_extent_value + 1 < local_160._M_extent_value * 2) {
            uVar21 = local_160._M_extent_value * 2;
          }
          if (-local_160._M_extent_value + 0x1c71c71c71c71c7 < local_160._M_extent_value) {
            uVar21 = 0x1c71c71c71c71c7;
          }
          SVar11 = (SourceLocation)operator_new(uVar21 * 0x48);
          _Var6._M_extent_value = local_160._M_extent_value;
          p = local_168;
          pSVar2 = (SourceLocation *)((long)((long)SVar11 + 0x10) + _Var7._M_extent_value * 0x48);
          *pSVar2 = SVar17;
          pSVar2[1] = SVar19;
          pNVar1 = (pointer)((long)SVar11 + _Var7._M_extent_value * 0x48);
          (pNVar1->name).text._M_len = sVar4;
          (pNVar1->name).text._M_str = pcVar5;
          *(pointer *)((long)((long)SVar11 + 0x20) + _Var7._M_extent_value * 0x48) =
               (pointer)CONCAT44(extraout_var,iVar8);
          ((__extent_storage<18446744073709551615UL> *)((long)SVar11 + 0x28))
          [_Var7._M_extent_value * 9]._M_extent_value = (size_t)extraout_RDX;
          ((ParameterValueAssignmentSyntax **)((long)SVar11 + 0x30))[_Var7._M_extent_value * 9] =
               (ParameterValueAssignmentSyntax *)0x0;
          ((SourceLocation *)((long)SVar11 + 0x38))[_Var7._M_extent_value * 9] = SVar13;
          lVar12 = (long)(local_160._M_extent_value * 0x48 + (long)local_168) - (long)__src;
          SVar18 = SVar11;
          SVar13 = local_168;
          if (lVar12 == 0) {
            SVar13 = SVar11;
            SVar18 = extraout_RDX_00;
            SVar17 = local_168;
            if (local_160._M_extent_value != 0) {
              do {
                SVar18 = SVar17;
                SVar19 = SVar13;
                for (lVar12 = 9; lVar12 != 0; lVar12 = lVar12 + -1) {
                  *(undefined8 *)SVar19 = *(undefined8 *)SVar18;
                  SVar18 = (SourceLocation)((char **)((long)SVar18 + 8) + (ulong)bVar23 * -2);
                  SVar19 = (SourceLocation)((char **)((long)SVar19 + 8) + (ulong)bVar23 * -2);
                }
                SVar18 = (SourceLocation)((long)SVar17 + 0x48);
                SVar13 = (SourceLocation)((long)SVar13 + 0x48);
                SVar17 = SVar18;
              } while (SVar18 != __src);
            }
          }
          else {
            while (SVar13 != __src) {
              SVar17 = SVar13;
              SVar19 = SVar18;
              for (lVar16 = 9; lVar16 != 0; lVar16 = lVar16 + -1) {
                *(undefined8 *)SVar19 = *(undefined8 *)SVar17;
                SVar17 = (SourceLocation)((char **)((long)SVar17 + 8) + (ulong)bVar23 * -2);
                SVar19 = (SourceLocation)((char **)((long)SVar19 + 8) + (ulong)bVar23 * -2);
              }
              _Var20._M_extent_value = (long)SVar13 + 0x48;
              SVar18 = (SourceLocation)((long)SVar18 + 0x48);
              SVar13 = (SourceLocation)_Var20._M_extent_value;
            }
            memcpy((pointer)((long)SVar11 + _Var7._M_extent_value * 0x48) + 1,(void *)__src,
                   ((lVar12 - 0x48U) / 0x48) * 0x48 + 0x48);
            SVar18 = extraout_RDX_01;
          }
          if (p != (SourceLocation)local_150) {
            operator_delete((void *)p);
            SVar18 = extraout_RDX_03;
            _Var6._M_extent_value = local_160._M_extent_value;
          }
        }
        else {
          ((SourceRange *)((long)__src + 0x10))->startLoc = SVar17;
          *(SourceLocation *)((long)__src + 0x18) = SVar19;
          *(size_t *)__src = sVar4;
          *(char **)((long)__src + 8) = pcVar5;
          ((span<const_slang::syntax::ElementSelectSyntax_*const,_18446744073709551615UL> *)
          ((long)__src + 0x20))->_M_ptr = (pointer)CONCAT44(extraout_var,iVar8);
          ((__extent_storage<18446744073709551615UL> *)((long)__src + 0x28))->_M_extent_value =
               (size_t)extraout_RDX;
          *(ParameterValueAssignmentSyntax **)((long)__src + 0x30) =
               (ParameterValueAssignmentSyntax *)0x0;
          *(SourceLocation *)((long)__src + 0x38) = SVar13;
          SVar18 = extraout_RDX;
          SVar11 = local_168;
          uVar21 = local_158;
          _Var6._M_extent_value = local_160._M_extent_value;
        }
        local_158 = uVar21;
        local_168 = SVar11;
        local_160._M_extent_value = _Var6._M_extent_value + 1;
        local_1e8[0].len = 0;
      }
      else {
        args = std::
               get<0ul,slang::syntax::ElementSelectSyntax_const*,slang::ast::LookupResult::MemberSelector>
                         (__v);
        SmallVectorBase<slang::syntax::ElementSelectSyntax_const*>::
        emplace_back<slang::syntax::ElementSelectSyntax_const*const&>
                  ((SmallVectorBase<slang::syntax::ElementSelectSyntax_const*> *)local_1e8,args);
        SVar18 = extraout_RDX_02;
      }
      pvVar9 = __v;
    } while (__v != selectors._M_ptr);
  }
  range_00.endLoc = (SourceLocation)_Var20._M_extent_value;
  range_00.startLoc = range.endLoc;
  pSVar14 = anon_unknown_39::getVirtualInterfaceTarget
                      ((anon_unknown_39 *)virtualInterface,(Type *)context,
                       (ASTContext *)range.startLoc,range_00);
  result->found = pSVar14;
  nameParts_00._M_extent._M_extent_value = local_160._M_extent_value;
  nameParts_00._M_ptr = (pointer)local_168;
  name.text._M_str = (char *)uStack_1a0;
  name.text._M_len = local_1a8;
  name.range.startLoc = (SourceLocation)local_198;
  name.range.endLoc = (SourceLocation)uStack_190;
  name.selectors._M_ptr = (pointer)local_188;
  name.selectors._M_extent._M_extent_value = uStack_180;
  name.paramAssignments = local_178;
  anon_unknown_39::lookupDownward
            (nameParts_00,name,context,(bitmask<slang::ast::LookupFlags>)0x0,result);
  if (local_1e8[0].data_ != (pointer)local_1e8[0].firstElement) {
    operator_delete(local_1e8[0].data_);
  }
  if (local_168 != (SourceLocation)local_150) {
    operator_delete((void *)local_168);
  }
  return;
}

Assistant:

void Lookup::selectChild(const Type& virtualInterface, SourceRange range,
                         std::span<LookupResult::Selector> selectors, const ASTContext& context,
                         LookupResult& result) {
    NameComponents unused;
    SmallVector<NamePlusLoc, 4> nameParts;
    SmallVector<const ElementSelectSyntax*> elementSelects;
    auto& comp = context.getCompilation();

    for (auto& selector : std::views::reverse(selectors)) {
        if (auto memberSel = std::get_if<LookupResult::MemberSelector>(&selector)) {
            NamePlusLoc npl;
            npl.dotLocation = memberSel->dotLocation;
            npl.name.text = memberSel->name;
            npl.name.range = memberSel->nameRange;
            std::ranges::reverse(elementSelects); // reverse the element selects since we initially
                                                  // saw them in reverse order
            npl.name.selectors = elementSelects.copy(comp);

            nameParts.push_back(npl);
            elementSelects.clear();
        }
        else {
            elementSelects.push_back(std::get<const ElementSelectSyntax*>(selector));
        }
    }

    result.found = getVirtualInterfaceTarget(virtualInterface, context, range);
    lookupDownward(nameParts, unused, context, LookupFlags::None, result);
}